

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::CheckExtensionDeclarationFieldType
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto,
          string_view type)

{
  char *pcVar1;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  string_view type_00;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  Descriptor *pDVar5;
  EnumDescriptor *pEVar6;
  DescriptorNames *pDVar7;
  ulong uVar8;
  AlphaNum *b;
  AlphaNum *pAVar9;
  string_view element_name;
  string expected_type;
  string actual_type;
  size_t in_stack_fffffffffffffef8;
  long *__s1;
  size_t local_f8;
  long local_f0 [2];
  AlphaNum *local_e0;
  size_t local_d8;
  undefined1 local_d0 [16];
  string local_c0;
  VoidPtr local_a0;
  code *pcStack_98;
  FieldDescriptor *local_90;
  char *local_88;
  AlphaNum **local_80;
  AlphaNum local_60;
  
  pAVar9 = (AlphaNum *)type._M_str;
  uVar8 = type._M_len;
  if (this->had_errors_ != false) {
    return;
  }
  pcVar1 = *(char **)(FieldDescriptor::kTypeToName + (ulong)field->type_ * 8);
  sVar4 = strlen(pcVar1);
  b = (AlphaNum *)local_d0;
  local_e0 = b;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,pcVar1,pcVar1 + sVar4);
  __s1 = local_f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xffffffffffffff00,pAVar9,pAVar9->digits_ + (uVar8 - 0x10));
  pDVar5 = FieldDescriptor::message_type(field);
  if ((pDVar5 != (Descriptor *)0x0) ||
     (pEVar6 = FieldDescriptor::enum_type(field), pEVar6 != (EnumDescriptor *)0x0)) {
    if (this->had_errors_ != false) goto LAB_001d48a7;
    pDVar5 = FieldDescriptor::message_type(field);
    if (pDVar5 == (Descriptor *)0x0) {
      pEVar6 = FieldDescriptor::enum_type(field);
      pDVar7 = &pEVar6->all_names_;
    }
    else {
      pDVar5 = FieldDescriptor::message_type(field);
      pDVar7 = &pDVar5->all_names_;
    }
    local_60.piece_._M_len = (size_t)*(ushort *)(pDVar7->payload_ + 2);
    b = (AlphaNum *)(pDVar7->payload_ + ~local_60.piece_._M_len);
    local_90 = (FieldDescriptor *)0x1;
    local_88 = ".";
    local_60.piece_._M_str = (char *)b;
    absl::lts_20250127::StrCat_abi_cxx11_(&local_c0,(lts_20250127 *)&local_90,&local_60,b);
    std::__cxx11::string::operator=((string *)&local_e0,(string *)&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
  }
  type_00._M_str = (char *)__s1;
  type_00._M_len = in_stack_fffffffffffffef8;
  bVar2 = anon_unknown_24::IsNonMessageType(type_00);
  if ((!bVar2) && ((uVar8 == 0 || ((char)(pAVar9->piece_)._M_len != '.')))) {
    local_90 = (FieldDescriptor *)0x1;
    local_88 = ".";
    local_60.piece_._M_len = uVar8;
    local_60.piece_._M_str = (char *)pAVar9;
    absl::lts_20250127::StrCat_abi_cxx11_(&local_c0,(lts_20250127 *)&local_90,&local_60,b);
    std::__cxx11::string::operator=((string *)&stack0xffffffffffffff00,(string *)&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((local_f8 != local_d8) ||
     ((local_f8 != 0 && (iVar3 = bcmp(__s1,local_e0,local_f8), iVar3 != 0)))) {
    pcVar1 = (field->all_names_).payload_;
    element_name._M_len = (ulong)*(ushort *)(pcVar1 + 2);
    element_name._M_str = pcVar1 + ~element_name._M_len;
    local_a0.obj = &local_90;
    local_88 = &stack0xffffffffffffff00;
    local_80 = &local_e0;
    pcStack_98 = absl::lts_20250127::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::CheckExtensionDeclarationFieldType(google::protobuf::FieldDescriptor_const&,google::protobuf::FieldDescriptorProto_const&,std::basic_string_view<char,std::char_traits<char>>)::__0,std::__cxx11::string>
    ;
    make_error.invoker_ =
         absl::lts_20250127::functional_internal::
         InvokeObject<google::protobuf::DescriptorBuilder::CheckExtensionDeclarationFieldType(google::protobuf::FieldDescriptor_const&,google::protobuf::FieldDescriptorProto_const&,std::basic_string_view<char,std::char_traits<char>>)::__0,std::__cxx11::string>
    ;
    make_error.ptr_.obj = local_a0.obj;
    local_90 = field;
    AddError(this,element_name,&proto->super_Message,EXTENDEE,make_error);
  }
LAB_001d48a7:
  if (__s1 != local_f0) {
    operator_delete(__s1,local_f0[0] + 1);
  }
  if (local_e0 != (AlphaNum *)local_d0) {
    operator_delete(local_e0,local_d0._0_8_ + 1);
  }
  return;
}

Assistant:

void DescriptorBuilder::CheckExtensionDeclarationFieldType(
    const FieldDescriptor& field, const FieldDescriptorProto& proto,
    absl::string_view type) {
  if (had_errors_) return;
  std::string actual_type(field.type_name());
  std::string expected_type(type);
  if (field.message_type() || field.enum_type()) {
    // Field message type descriptor can be in a partial state which will cause
    // segmentation fault if it is being accessed.
    if (had_errors_) return;
    absl::string_view full_name = field.message_type() != nullptr
                                      ? field.message_type()->full_name()
                                      : field.enum_type()->full_name();
    actual_type = absl::StrCat(".", full_name);
  }
  if (!IsNonMessageType(type) && !absl::StartsWith(type, ".")) {
    expected_type = absl::StrCat(".", type);
  }
  if (expected_type != actual_type) {
    AddError(field.full_name(), proto, DescriptorPool::ErrorCollector::EXTENDEE,
             [&] {
               return absl::Substitute(
                   "\"$0\" extension field $1 is expected to be type "
                   "\"$2\", not \"$3\".",
                   field.containing_type()->full_name(), field.number(),
                   expected_type, actual_type);
             });
  }
}